

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_piecewise_linear.c
# Opt level: O3

float fe_warp_piecewise_linear_unwarped_to_warped(float linear)

{
  if (is_neutral == '\x01') {
    if (linear < params[1]) {
      return linear * params[0];
    }
    linear = linear * final_piece[0] + final_piece[1];
  }
  return linear;
}

Assistant:

float
fe_warp_piecewise_linear_unwarped_to_warped(float linear)
{
    if (is_neutral) {
        return linear;
    }
    else {
        float temp;
        /* nonlinear = a * linear - b */
        if (linear < params[1]) {
            temp = linear * params[0];
        }
        else {
            temp = final_piece[0] * linear + final_piece[1];
        }
        return temp;
    }
}